

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.hpp
# Opt level: O0

void * __thiscall
Lib::
SkipList<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_*,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::SListIntermediateNode::NodePtrComparator>
::insertPositionRaw<Kernel::TermList::Top>
          (SkipList<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_*,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::SListIntermediateNode::NodePtrComparator>
           *this,Top key)

{
  Node *pNVar1;
  bool bVar2;
  Comparison CVar3;
  Node *l;
  uint uVar4;
  undefined8 *in_RDI;
  Node *next;
  Node *left;
  uint h;
  Node *newNode;
  uint nodeHeight;
  Node *local_50;
  undefined4 in_stack_ffffffffffffffb8;
  uint local_34;
  
  local_34 = 0;
  while (bVar2 = Random::getBit(), bVar2) {
    local_34 = local_34 + 1;
  }
  if (*(uint *)(in_RDI + 1) <= local_34) {
    if (*(uint *)(in_RDI + 1) < 0x20) {
      local_34 = *(uint *)(in_RDI + 1);
      *(int *)(in_RDI + 1) = *(int *)(in_RDI + 1) + 1;
    }
    else {
      local_34 = *(int *)(in_RDI + 1) - 1;
    }
  }
  l = allocate((uint)((ulong)in_RDI >> 0x20));
  uVar4 = *(int *)(in_RDI + 1) - 1;
  pNVar1 = (Node *)*in_RDI;
  do {
    while (local_50 = pNVar1, pNVar1 = local_50->nodes[uVar4], pNVar1 != (Node *)0x0) {
      CVar3 = Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::
              SListIntermediateNode::NodePtrComparator::compare
                        ((Top *)l,(Node *)CONCAT44(uVar4,in_stack_ffffffffffffffb8));
      if (CVar3 == LESS) {
        if (uVar4 <= local_34) {
          l->nodes[uVar4] = pNVar1;
          local_50->nodes[uVar4] = l;
          if (uVar4 == 0) {
            return l;
          }
        }
        uVar4 = uVar4 - 1;
        pNVar1 = local_50;
      }
      else if (1 < (uint)CVar3) {
        pNVar1 = local_50;
      }
    }
    if (uVar4 <= local_34) {
      local_50->nodes[uVar4] = l;
      l->nodes[uVar4] = (Node *)0x0;
      if (uVar4 == 0) {
        return l;
      }
    }
    uVar4 = uVar4 - 1;
    pNVar1 = local_50;
  } while( true );
}

Assistant:

void* insertPositionRaw(Key key)
  {
    // select a random height between 0 and top
    unsigned nodeHeight = 0;
    while (Random::getBit()) {
      nodeHeight++;
    }
    if (nodeHeight >= _top) {
      if (_top < SKIP_LIST_MAX_HEIGHT) {
	nodeHeight = _top;
	_top++;
      }
      else {
	ASS(_top == SKIP_LIST_MAX_HEIGHT);
	nodeHeight = _top - 1;
      }
    }
    Node* newNode = allocate(nodeHeight);


    unsigned h = _top - 1;


    // left is a node with a value smaller than that of newNode and having
    // a large enough height.
    // this node is on the left of the inserted one
    Node* left = _left;
    for (;;) {
      Node* next = left->nodes[h];
      if (next == 0) {
	if(h<=nodeHeight) {
	  left->nodes[h] = newNode;
	  newNode->nodes[h] = 0;
	  if (h == 0) {
	    return &newNode->value;
	  }
	}
	h--;
	continue;
      }
      // next != 0
      switch (ValueComparator::compare(key,next->value))
	{
	case LESS:
	  // the node should be inserted on the left
	  if(h<=nodeHeight) {
	    newNode->nodes[h] = next;
	    left->nodes[h] = newNode;
	    if (h == 0) {
	      return &newNode->value;
	    }
	  }
	  h--;
	  break;

	case EQUAL: //we insert equal elements next to each other
	case GREATER:
	  left = next;
	  break;

#if VDEBUG
	default:
	  ASSERTION_VIOLATION;
#endif
	}
    }
  }